

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDescriptor.cpp
# Opt level: O3

fdPtr __thiscall Liby::FileDescriptor::openFile(FileDescriptor *this,string *filepath)

{
  Logger *this_00;
  int *piVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  fdPtr fVar2;
  undefined1 local_1d;
  int fd;
  
  if (filepath->_M_string_length != 0) {
    fd = open((filepath->_M_dataplus)._M_p,2);
    if (-1 < fd) {
      *(undefined8 *)this = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<Liby::FileDescriptor,std::allocator<Liby::FileDescriptor>,int&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 2),(FileDescriptor **)this,
                 (allocator<Liby::FileDescriptor> *)&local_1d,&fd);
      in_RDX._M_pi = extraout_RDX;
      goto LAB_00108f31;
    }
    this_00 = Logger::getLogger();
    piVar1 = __errno_location();
    strerror(*piVar1);
    Logger::log(this_00,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    in_RDX._M_pi = extraout_RDX_00;
  }
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 2) = 0;
LAB_00108f31:
  fVar2.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  fVar2.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (fdPtr)fVar2.super___shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

fdPtr Liby::FileDescriptor::openFile(const std::string &filepath) {
    int fd;
    if (!filepath.empty()) {
        if ((fd = ::open(filepath.data(), O_RDWR)) >= 0) {
            return std::make_shared<FileDescriptor>(fd);
        } else {
            error("open %s error: %s", filepath.data(), ::strerror(errno));
        }
    }
    return nullptr;
}